

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O0

void sys_unqueuegui(void *client)

{
  t_guiqueue *fatso;
  _guiqueue *fatso_00;
  bool bVar1;
  t_guiqueue *gq2;
  t_guiqueue *gq;
  void *client_local;
  
  while( true ) {
    bVar1 = false;
    if ((pd_maininstance.pd_inter)->i_guiqueuehead != (t_guiqueue *)0x0) {
      bVar1 = (pd_maininstance.pd_inter)->i_guiqueuehead->gq_client == client;
    }
    if (!bVar1) break;
    fatso = (pd_maininstance.pd_inter)->i_guiqueuehead;
    (pd_maininstance.pd_inter)->i_guiqueuehead = (pd_maininstance.pd_inter)->i_guiqueuehead->gq_next
    ;
    freebytes(fatso,0x20);
  }
  if ((pd_maininstance.pd_inter)->i_guiqueuehead != (t_guiqueue *)0x0) {
    fatso_00 = (pd_maininstance.pd_inter)->i_guiqueuehead;
    do {
      gq2 = fatso_00;
      fatso_00 = gq2->gq_next;
      if (fatso_00 == (_guiqueue *)0x0) {
        return;
      }
    } while (fatso_00->gq_client != client);
    gq2->gq_next = fatso_00->gq_next;
    freebytes(fatso_00,0x20);
  }
  return;
}

Assistant:

void sys_unqueuegui(void *client)
{
    t_guiqueue *gq, *gq2;
    while (INTER->i_guiqueuehead && INTER->i_guiqueuehead->gq_client == client)
    {
        gq = INTER->i_guiqueuehead;
        INTER->i_guiqueuehead = INTER->i_guiqueuehead->gq_next;
        t_freebytes(gq, sizeof(*gq));
    }
    if (!INTER->i_guiqueuehead)
        return;
    for (gq = INTER->i_guiqueuehead; (gq2 = gq->gq_next); gq = gq2)
        if (gq2->gq_client == client)
        {
            gq->gq_next = gq2->gq_next;
            t_freebytes(gq2, sizeof(*gq2));
            break;
        }
}